

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_daxpy_ie(int n,double alpha,double *x,int incx,double *y,int incy)

{
  int local_38;
  int i;
  int incy_local;
  double *y_local;
  int incx_local;
  double *x_local;
  double alpha_local;
  int n_local;
  
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x5f,"void la_daxpy_ie(int, double, const double *, int, double *, int)");
  }
  if (y != (double *)0x0) {
    if (x != y) {
      for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
        y[local_38 * incy] = alpha * x[local_38 * incx] + y[local_38 * incy];
      }
      return;
    }
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x61,"void la_daxpy_ie(int, double, const double *, int, double *, int)");
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x60,"void la_daxpy_ie(int, double, const double *, int, double *, int)");
}

Assistant:

void la_daxpy_ie(
        int n,
        double alpha,
        const double *x, int incx,
        double *y, int incy)
{
    assert(x);
    assert(y);
    assert(x != y);

    for (int i = 0; i < n; i++) {
        y[i * incy] = alpha * x[i * incx] + y[i * incy];
    }
}